

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,true,false>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lentry;
  long lentry_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  interval_t iVar13;
  interval_t left;
  interval_t left_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar2 = *ldata;
      lVar7 = 8;
      iVar12 = count;
      do {
        iVar13.micros = lVar2;
        iVar13._0_8_ = *(undefined8 *)((long)&rdata->months + lVar7);
        iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                           (*(MultiplyOperator **)((long)rdata + lVar7 + -8),iVar13,count);
        *(long *)((long)result_data + lVar7 + -8) = iVar13._0_8_;
        *(int64_t *)((long)&result_data->months + lVar7) = iVar13.micros;
        lVar7 = lVar7 + 0x10;
        iVar12 = iVar12 - 1;
      } while (iVar12 != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
LAB_01489e16:
        uVar6 = uVar8;
        if (uVar8 < uVar5) {
          lVar2 = *ldata;
          uVar10 = uVar8 << 4 | 8;
          uVar3 = uVar4;
          do {
            left.micros = lVar2;
            left._0_8_ = *(undefined8 *)((long)&rdata->months + uVar10);
            iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                               (*(MultiplyOperator **)((long)rdata + (uVar10 - 8)),left,uVar3);
            *(long *)((long)result_data + (uVar10 - 8)) = iVar13._0_8_;
            *(int64_t *)((long)&result_data->months + uVar10) = iVar13.micros;
            uVar8 = uVar8 + 1;
            uVar10 = uVar10 + 0x10;
            uVar6 = uVar5;
          } while (uVar5 != uVar8);
        }
      }
      else {
        uVar3 = puVar1[uVar4];
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
        uVar6 = uVar5;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01489e16;
          uVar6 = uVar8;
          if (uVar8 < uVar5) {
            uVar9 = uVar8 << 4 | 8;
            uVar11 = 0;
            uVar10 = uVar4;
            do {
              if ((uVar3 >> (uVar11 & 0x3f) & 1) != 0) {
                left_00.micros = *ldata;
                left_00._0_8_ = *(undefined8 *)((long)&rdata->months + uVar9);
                iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                   (*(MultiplyOperator **)((long)rdata + (uVar9 - 8)),left_00,uVar10
                                   );
                *(long *)((long)result_data + (uVar9 - 8)) = iVar13._0_8_;
                *(int64_t *)((long)&result_data->months + uVar9) = iVar13.micros;
              }
              uVar11 = uVar11 + 1;
              uVar9 = uVar9 + 0x10;
              uVar6 = uVar5;
            } while (uVar5 - uVar8 != uVar11);
          }
        }
      }
      uVar4 = uVar4 + 1;
      uVar8 = uVar6;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}